

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::deleteRenderbuffers(GLContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  int local_24;
  int i;
  deUint32 *renderbuffers_local;
  int numRenderbuffers_local;
  GLContext *this_local;
  
  for (local_24 = 0; local_24 < numRenderbuffers; local_24 = local_24 + 1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              (&this->m_allocatedRbos,renderbuffers + local_24);
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(this->m_wrapper,numRenderbuffers,renderbuffers);
  return;
}

Assistant:

void GLContext::deleteRenderbuffers (int numRenderbuffers, const deUint32* renderbuffers)
{
	for (int i = 0; i < numRenderbuffers; i++)
		m_allocatedRbos.erase(renderbuffers[i]);
	m_wrapper->glDeleteRenderbuffers(numRenderbuffers, renderbuffers);
}